

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trapezoidal_decomposition.cc
# Opt level: O1

void __thiscall PolygonTriangulation::init_permutation_table(PolygonTriangulation *this)

{
  pointer puVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->permutation_,(ulong)this->num_segments_);
  puVar1 = (this->permutation_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->permutation_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    uVar2 = 1;
    iVar3 = -1;
    uVar4 = 0;
    do {
      puVar1[uVar4] = this->num_segments_ + iVar3;
      uVar4 = (ulong)uVar2;
      puVar1 = (this->permutation_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar2 = uVar2 + 1;
      iVar3 = iVar3 + -1;
    } while (uVar4 < (ulong)((long)(this->permutation_).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2));
  }
  return;
}

Assistant:

void PolygonTriangulation::init_permutation_table()
{
  permutation_.resize(num_segments_);
  for (auto i = 0u; i < permutation_.size(); ++i) {
    permutation_[i] = num_segments_-i-1;
  }
#if 0
  const auto seed = std::chrono::system_clock::now().time_since_epoch().count();
  fprintf(stderr, "seed used : %lu\n", seed);
  std::shuffle(permutation_.begin(), permutation_.end(), std::default_random_engine(seed));
#endif
}